

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_read_mapbc_token(REF_DICT ref_dict,char *mapbc_filename,char *token)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t __n;
  undefined8 uVar4;
  char *pcVar5;
  REF_STATUS RVar6;
  REF_INT n;
  REF_INT type;
  REF_INT id;
  char name [1024];
  int local_44c;
  REF_INT local_448;
  REF_INT local_444;
  REF_DICT local_440;
  char local_438 [1032];
  
  __stream = fopen(mapbc_filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",mapbc_filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1a9,
           "ref_phys_read_mapbc_token","unable to open file");
    RVar6 = 2;
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%d",&local_44c);
    if (iVar1 == 1) {
      local_440 = ref_dict;
      if (0 < local_44c) {
        iVar1 = 0;
        do {
          iVar2 = __isoc99_fscanf(__stream,"%d",&local_444);
          if (iVar2 != 1) {
            pcVar5 = "read id";
            uVar4 = 0x1ac;
            goto LAB_001a6c77;
          }
          iVar2 = __isoc99_fscanf(__stream,"%d",&local_448);
          if (iVar2 != 1) {
            pcVar5 = "read type";
            uVar4 = 0x1ad;
            goto LAB_001a6c77;
          }
          iVar2 = fgetc(__stream);
          if (iVar2 != 0x20) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x1ae,"ref_phys_read_mapbc_token","expected space",0x20,(long)iVar2);
            goto LAB_001a6c7e;
          }
          fgets(local_438,0x400,__stream);
          __n = strlen(token);
          iVar2 = strncmp(local_438,token,__n);
          if ((iVar2 == 0) && (uVar3 = ref_dict_store(local_440,local_444,local_448), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x1b2,"ref_phys_read_mapbc_token",(ulong)uVar3,"store");
            return uVar3;
          }
          iVar1 = iVar1 + 1;
        } while (iVar1 < local_44c);
      }
      fclose(__stream);
      RVar6 = 0;
    }
    else {
      pcVar5 = "number of lines";
      uVar4 = 0x1aa;
LAB_001a6c77:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar4,
             "ref_phys_read_mapbc_token",pcVar5);
LAB_001a6c7e:
      RVar6 = 1;
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_phys_read_mapbc_token(REF_DICT ref_dict,
                                             const char *mapbc_filename,
                                             const char *token) {
  FILE *file;
  REF_INT i, n, id, type;
  char name[1024];
  file = fopen(mapbc_filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc_filename);
  RNS(file, "unable to open file");
  RES(1, fscanf(file, "%d", &n), "number of lines");
  for (i = 0; i < n; i++) {
    RES(1, fscanf(file, "%d", &id), "read id");
    RES(1, fscanf(file, "%d", &type), "read type");
    REIS(32, fgetc(file), "expected space");
    fgets(name, sizeof(name), file);
    /* printf(">%s<>%s<\n",name,token); */
    if (0 == strncmp(name, token, strlen(token))) {
      RSS(ref_dict_store(ref_dict, id, type), "store");
    }
  }
  fclose(file);
  return REF_SUCCESS;
}